

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

int absl::lts_20250127::GenericCompare<int,absl::lts_20250127::Cord>
              (Cord *lhs,Cord *rhs,size_t size_to_compare)

{
  int iVar1;
  unsigned_long *puVar2;
  const_pointer __s1;
  const_pointer __s2;
  size_type sStack_60;
  int memcmp_res;
  size_type local_58;
  ulong local_50;
  size_t compared_size;
  string_view rhs_chunk;
  string_view lhs_chunk;
  size_t size_to_compare_local;
  Cord *rhs_local;
  Cord *lhs_local;
  
  join_0x00000010_0x00000000_ = Cord::GetFirstChunk(lhs);
  _compared_size = Cord::GetFirstChunk(rhs);
  local_58 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_chunk._M_str);
  sStack_60 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&compared_size);
  puVar2 = std::min<unsigned_long>(&local_58,&stack0xffffffffffffffa0);
  local_50 = *puVar2;
  if (local_50 <= size_to_compare) {
    __s1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_chunk._M_str);
    __s2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&compared_size);
    iVar1 = memcmp(__s1,__s2,local_50);
    if ((local_50 == size_to_compare) || (iVar1 != 0)) {
      lhs_local._4_4_ = anon_unknown_58::ComputeCompareResult<int>(iVar1);
    }
    else {
      iVar1 = Cord::CompareSlowPath(lhs,rhs,local_50,size_to_compare);
      lhs_local._4_4_ = anon_unknown_58::ComputeCompareResult<int>(iVar1);
    }
    return lhs_local._4_4_;
  }
  __assert_fail("size_to_compare >= compared_size",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0x3d7,
                "ResultType absl::GenericCompare(const Cord &, const RHS &, size_t) [ResultType = int, RHS = absl::Cord]"
               );
}

Assistant:

ResultType GenericCompare(const Cord& lhs, const RHS& rhs,
                          size_t size_to_compare) {
  absl::string_view lhs_chunk = Cord::GetFirstChunk(lhs);
  absl::string_view rhs_chunk = Cord::GetFirstChunk(rhs);

  size_t compared_size = std::min(lhs_chunk.size(), rhs_chunk.size());
  assert(size_to_compare >= compared_size);
  int memcmp_res = ::memcmp(lhs_chunk.data(), rhs_chunk.data(), compared_size);
  if (compared_size == size_to_compare || memcmp_res != 0) {
    return ComputeCompareResult<ResultType>(memcmp_res);
  }

  return ComputeCompareResult<ResultType>(
      lhs.CompareSlowPath(rhs, compared_size, size_to_compare));
}